

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::detail::ExistingPathValidator::ExistingPathValidator(ExistingPathValidator *this)

{
  anon_class_1_0_00000001 local_45 [20];
  allocator local_31;
  string local_30;
  ExistingPathValidator *local_10;
  ExistingPathValidator *this_local;
  
  local_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_30,"PATH(existing)",&local_31);
  Validator::Validator(&this->super_Validator,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,local_45);
  return;
}

Assistant:

ExistingPathValidator() : Validator("PATH(existing)") {
        func_ = [](std::string &filename) {
            auto path_result = check_path(filename.c_str());
            if(path_result == path_type::nonexistant) {
                return "Path does not exist: " + filename;
            }
            return std::string();
        };
    }